

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O0

void __thiscall Zuker::calculate_E(Zuker *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  value_type vVar6;
  value_type vVar7;
  uint a_00;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Zuker *this_00;
  ostream *poVar12;
  ostream *this_01;
  reference pvVar13;
  char *pcVar14;
  int *piVar15;
  int iVar16;
  int i_00;
  Zuker *in_RDI;
  vector<int,_std::allocator<int>_> *pvVar17;
  __type_conflict _Var18;
  int idx;
  int idx1;
  int bp_int;
  int an_int;
  int _yj;
  int _2yj;
  int xi2_;
  int xi_;
  int type;
  int yj;
  int xi;
  int y;
  int x;
  int l;
  int lb;
  int la;
  int n_codon_bp;
  int n_codon_an;
  int n_codon_b;
  int n_codon_a;
  int ppb;
  int pna;
  int pb;
  int pa;
  int b;
  int j;
  int i;
  int a;
  int max_a;
  int len;
  vector<int,_std::allocator<int>_> MT;
  vector<int,_std::allocator<int>_> H;
  vector<int,_std::allocator<int>_> T1;
  vector<int,_std::allocator<int>_> T;
  int nuc_len;
  string dn;
  string cp;
  string bp;
  string an;
  int t;
  int energy;
  int min_energy;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  value_type in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  value_type in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  value_type in_stack_fffffffffffffcd0;
  value_type vVar19;
  undefined4 in_stack_fffffffffffffcd4;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  value_type in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  value_type in_stack_fffffffffffffd00;
  value_type vVar20;
  undefined4 in_stack_fffffffffffffd04;
  int y_00;
  int *in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd18;
  int pb_00;
  int *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd28;
  int n_codon_bp_00;
  int *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd4c;
  int *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  Zuker *in_stack_fffffffffffffd60;
  value_type in_stack_fffffffffffffd70;
  undefined1 *puVar21;
  undefined1 *puVar22;
  int in_stack_fffffffffffffe18;
  int local_1e4;
  int in_stack_fffffffffffffe20;
  int local_1dc;
  int in_stack_fffffffffffffe28;
  value_type bp_int_00;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1ac;
  int local_1a8;
  int local_170;
  uint local_16c;
  int local_164;
  vector<int,_std::allocator<int>_> local_138;
  undefined1 local_11d;
  undefined4 local_11c;
  vector<int,_std::allocator<int>_> local_118;
  undefined1 local_ed;
  undefined4 local_ec;
  vector<int,_std::allocator<int>_> local_e8;
  int local_cc;
  string local_c8 [4];
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Zuker *in_stack_ffffffffffffff50;
  string local_a8 [8];
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  value_type local_44;
  int local_40;
  int local_3c [3];
  
  local_3c[0] = 10000000;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78);
  std::__cxx11::string::string(local_a8);
  std::__cxx11::string::string(local_c8);
  local_cc = in_RDI->n * 3;
  local_ec = 10000000;
  puVar22 = &local_ed;
  std::allocator<int>::allocator((allocator<int> *)0x14d52d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (value_type *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::allocator<int>::~allocator((allocator<int> *)0x14d55e);
  local_11c = 0;
  puVar21 = &local_11d;
  std::allocator<int>::allocator((allocator<int> *)0x14d57e);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (value_type *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::allocator<int>::~allocator((allocator<int> *)0x14d5af);
  std::allocator<int>::allocator((allocator<int> *)0x14d5cf);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (value_type *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::allocator<int>::~allocator((allocator<int> *)0x14d600);
  std::allocator<int>::allocator((allocator<int> *)0x14d620);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (value_type *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::allocator<int>::~allocator((allocator<int> *)0x14d651);
  memset(calculate_E::updatedH,0,0x60);
  memset(calculate_E::updatedM,0,0x100);
  memset(calculate_E::updatedT,0,0x600);
  for (local_164 = 4; local_164 < local_cc; local_164 = local_164 + 1) {
    this_00 = (Zuker *)std::operator<<((ostream *)&std::cout,"\rE/M -- Completed: ");
    poVar12 = (ostream *)
              std::ostream::operator<<(this_00,((double)local_164 / (double)local_cc) * 100.0);
    this_01 = std::operator<<(poVar12,"%");
    std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
    iVar1 = in_RDI->n;
    _Var18 = std::floor<int>(0);
    iVar16 = (int)_Var18;
    for (local_16c = 0; (int)local_16c < iVar1 - iVar16; local_16c = local_16c + 1) {
      for (local_170 = 0; local_170 < 3; local_170 = local_170 + 1) {
        i_00 = (local_170 + local_164) % 3;
        a_00 = (int)(local_16c * 3 + local_170 + local_164) / 3;
        if (a_00 != in_RDI->n) {
          pvVar17 = &in_RDI->protein;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)(int)local_16c)
          ;
          iVar2 = *pvVar13;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar17,(long)(int)a_00);
          iVar3 = *pvVar13;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (pvVar17,(long)(int)(local_16c + 1));
          iVar8 = *pvVar13;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (pvVar17,(long)(int)(a_00 - 1));
          iVar9 = *pvVar13;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)iVar2);
          iVar4 = *pvVar13;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)iVar3);
          iVar5 = *pvVar13;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)iVar8);
          vVar6 = *pvVar13;
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)iVar9);
          vVar7 = *pvVar13;
          iVar8 = sigma(local_16c,local_170);
          iVar9 = sigma(a_00,i_00);
          memset(calculate_E::updatedH,0,0x60);
          memset(calculate_E::updatedM,0,0x100);
          memset(calculate_E::updatedT,0,0x600);
          for (local_1a8 = 0; local_1a8 < iVar4; local_1a8 = local_1a8 + 1) {
            local_1ac = 0;
            while( true ) {
              pb_00 = (int)in_stack_fffffffffffffd20;
              y_00 = (int)in_stack_fffffffffffffd10;
              if (iVar5 <= local_1ac) break;
              iVar11 = BP_pair[nucleotides[iVar2][local_1a8][local_170] + 1]
                       [nucleotides[iVar3][local_1ac][i_00] + 1];
              local_1bc = 0;
              local_1c0 = 0;
              local_1c4 = 0;
              local_1c8 = 0;
              if (local_170 == 0) {
                local_1bc = nucleotides[iVar2][local_1a8][1];
                local_1c0 = nucleotides[iVar2][local_1a8][2];
              }
              if (i_00 == 2) {
                local_1c8 = nucleotides[iVar3][local_1ac][1];
                local_1c4 = nucleotides[iVar3][local_1ac][0];
              }
              if (local_170 == 1) {
                local_1bc = nucleotides[iVar2][local_1a8][2];
              }
              if (i_00 == 1) {
                local_1c8 = nucleotides[iVar3][local_1ac][0];
              }
              if (iVar11 == 0) {
                calculate_M(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                            in_stack_fffffffffffffd58,
                            (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                            (int)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                            in_stack_fffffffffffffd70);
              }
              else {
                local_3c[0] = 10000000;
                local_40 = 10000000;
                local_44 = 0;
                pvVar17 = &in_RDI->ava_nucle_p;
                pcVar14 = index(in_RDI,(char *)(ulong)local_16c,local_1a8);
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (pvVar17,(long)(int)pcVar14);
                vVar19 = *pvVar13;
                pvVar17 = &in_RDI->ava_nucle_m;
                pcVar14 = index(in_RDI,(char *)(ulong)a_00,local_1ac);
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (pvVar17,(long)(int)pcVar14);
                vVar20 = *pvVar13;
                iVar10 = T_index(iVar11,local_1bc,local_1c0,local_1c4,local_1c8);
                n_codon_bp_00 = (int)in_stack_fffffffffffffd30;
                if ((calculate_E::updatedT[iVar10] & 1U) == 0) {
                  if ((iVar9 - iVar8) + 1 < 9) {
                    in_stack_fffffffffffffce0 = i_00;
                    in_stack_fffffffffffffce8 = local_1a8;
                    in_stack_fffffffffffffcf0 = local_1ac;
                    in_stack_fffffffffffffcf8 = vVar19;
                    in_stack_fffffffffffffd70 = vVar19;
                    bp_int_00 = vVar20;
                    local_1dc = hairpin(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                                        in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                        in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                                        in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
                    in_stack_fffffffffffffd60 = (Zuker *)std::min<int>(local_3c,&local_1dc);
                    local_3c[0] = *(int *)&(in_stack_fffffffffffffd60->Z).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start;
                    in_stack_fffffffffffffd00 = vVar20;
                  }
                  else {
                    in_stack_fffffffffffffe28 = H_index(iVar11,local_1bc,local_1c8);
                    bp_int_00 = vVar20;
                    if ((calculate_E::updatedH[in_stack_fffffffffffffe28] & 1U) == 0) {
                      iVar11 = hairpin((Zuker *)CONCAT44(in_stack_fffffffffffffcd4,
                                                         in_stack_fffffffffffffcd0),
                                       in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,
                                       in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0,
                                       in_stack_fffffffffffffcbc,in_stack_fffffffffffffce0,
                                       in_stack_fffffffffffffce8);
                      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                          (&local_138,(long)in_stack_fffffffffffffe28);
                      *pvVar13 = iVar11;
                      calculate_E::updatedH[in_stack_fffffffffffffe28] = true;
                      bp_int_00 = vVar20;
                    }
                    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                        (&local_138,(long)in_stack_fffffffffffffe28);
                    piVar15 = std::min<int>(local_3c,pvVar13);
                    local_3c[0] = *piVar15;
                  }
                  if (local_3c[0] < 10000000) {
                    local_40 = local_3c[0];
                    local_44 = -1;
                  }
                  in_stack_fffffffffffffd5c =
                       internal(this_00,(int)((ulong)poVar12 >> 0x20),(int)poVar12,
                                (int)((ulong)this_01 >> 0x20),(int)this_01,
                                (int)((ulong)_Var18 >> 0x20),(int)puVar21,(int)in_RDI,(int)puVar22,
                                in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
                                in_stack_fffffffffffffe28,bp_int_00);
                  in_stack_fffffffffffffe20 = in_stack_fffffffffffffd5c;
                  in_stack_fffffffffffffd50 =
                       std::min<int>(local_3c,(int *)&stack0xfffffffffffffe20);
                  iVar11 = *in_stack_fffffffffffffd50;
                  in_stack_fffffffffffffcd0 = vVar19;
                  local_3c[0] = iVar11;
                  if (iVar11 < local_40) {
                    pvVar17 = &in_RDI->EB;
                    pcVar14 = index(in_RDI,(char *)(ulong)local_16c,a_00);
                    in_stack_fffffffffffffd4c = (int)pcVar14;
                    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                        (pvVar17,(long)in_stack_fffffffffffffd4c);
                    local_44 = *pvVar13;
                    in_stack_fffffffffffffcd0 = vVar19;
                    local_40 = iVar11;
                  }
                  in_stack_fffffffffffffcc0 = vVar6;
                  in_stack_fffffffffffffcc8 = vVar7;
                  local_1e4 = multi_loop((Zuker *)CONCAT44(in_stack_fffffffffffffd04,
                                                           in_stack_fffffffffffffd00),
                                         in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,
                                         in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0,
                                         in_stack_fffffffffffffcec,y_00,in_stack_fffffffffffffd18,
                                         pb_00,in_stack_fffffffffffffd28,n_codon_bp_00);
                  in_stack_fffffffffffffd30 = std::min<int>(local_3c,&local_1e4);
                  in_stack_fffffffffffffd28 = *in_stack_fffffffffffffd30;
                  if (in_stack_fffffffffffffd28 < local_40) {
                    local_44 = -3;
                  }
                  local_3c[0] = in_stack_fffffffffffffd28;
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_e8,(long)iVar10);
                  *pvVar13 = in_stack_fffffffffffffd28;
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_118,(long)iVar10);
                  *pvVar13 = local_44;
                  calculate_E::updatedT[iVar10] = true;
                }
                else {
                  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_118,(long)iVar10);
                  local_44 = *pvVar13;
                }
                pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_e8,(long)iVar10)
                ;
                vVar19 = *pvVar13;
                local_3c[0] = vVar19;
                in_stack_fffffffffffffd20 =
                     Access_E((Zuker *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)
                              ,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,
                              in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0,
                              in_stack_fffffffffffffcbc,in_stack_fffffffffffffce0);
                *in_stack_fffffffffffffd20 = vVar19;
                in_stack_fffffffffffffd10 =
                     Access_EB((Zuker *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0
                                                ),in_stack_fffffffffffffccc,
                               in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,
                               in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                               in_stack_fffffffffffffce0);
                *in_stack_fffffffffffffd10 = local_44;
                calculate_M(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                            in_stack_fffffffffffffd58,
                            (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                            (int)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                            in_stack_fffffffffffffd70);
              }
              local_1ac = local_1ac + 1;
            }
          }
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  return;
}

Assistant:

void Zuker::calculate_E() {
    int min_energy = inf, energy = inf;
    int t;
    string an,bp,cp,dn;

    int nuc_len = 3*n;
    vector<int> T(1536,inf);
    vector<int> T1(1536,0);
    vector<int> H(96,inf);
    vector<int> MT(256, inf);

    static bool updatedT[1536];
    static bool updatedH[96];
    static bool updatedM[256];

    memset(updatedH, false, 96);
    memset(updatedM, false, 256);
    memset(updatedT, false, 1536);


    for (int len = 4; len < nuc_len; ++len) {
        std::cout << "\rE/M -- Completed: " << (len*1.0/nuc_len) * 100 << "%" << std::flush;

        int max_a = n - (int)floor(len/3);
        for (int a = 0; a < max_a; ++a) {
            for (int i = 0; i < 3; ++i) {

                int j = (i+len) % 3;
                int b = (3*a+i+len) / 3;

                if (b == n) continue;
                int pa = protein[a];
                int pb = protein[b];
                int pna = protein[a + 1];
                int ppb = protein[b - 1];
                const int n_codon_a = n_codon[pa];
                const int n_codon_b = n_codon[pb];
                const int n_codon_an = n_codon[pna];
                const int n_codon_bp = n_codon[ppb];
                int la = sigma(a,i);
                int lb = sigma(b,j);
                int l = lb - la;

                // set updatedT to false for each entry
                // set updatedH to false for each entry
                // memset
                memset(updatedH, false, 96);
                memset(updatedM, false, 256);
                memset(updatedT, false, 1536); //4096

                for (int x = 0; x < n_codon_a; x++) {
                    for (int y = 0; y < n_codon_b; y++) {
                        int xi = nucleotides[pa][x][i];
                        int yj = nucleotides[pb][y][j];

                        int type = BP_pair[xi+1][yj+1];

                        int xi_ = 0,xi2_ = 0, _2yj = 0, _yj = 0;
                        if (i == 0) {
                            xi_ = nucleotides[pa][x][i+1];
                            xi2_ = nucleotides[pa][x][i+2];
                        }
                        if (j == 2) {
                            _yj = nucleotides[pb][y][j-1];
                            _2yj = nucleotides[pb][y][j-2];
                        }
                        if (i == 1) {
                            xi_ = nucleotides[pa][x][i+1];
                        }
                        if (j == 1) {
                            _yj = nucleotides[pb][y][j-1];
                        }

                        // ends not paired
                        if (!type) {
                            calculate_M(a,b,i,j,x,y);
                            continue;
                        }

                        min_energy = inf, energy = inf, t = 0;


                        int an_int = ava_nucle_p[index(a,x,i)];
                        int bp_int = ava_nucle_m[index(b,y,j)];


                        int idx1 = T_index(type, xi_,xi2_,_2yj, _yj); //
                        if (!updatedT[idx1]) {
                            // hairpin
                            if (l + 1 > 8) {
                                int idx = H_index(type, xi_, _yj); //
                                if (!updatedH[idx]) {
                                    H[idx] = hairpin(la, lb, l, xi, yj, an_int, bp_int);
                                    updatedH[idx] = true;
                                }
                                min_energy = min(min_energy, H[idx]);
                            }
                            else {
                                min_energy = min(min_energy, hairpin(la, lb, l, pa, pb, pna, ppb, n_codon_an, n_codon_bp, xi, yj, i, j, x, y, an_int, bp_int));
                            }
                            if (energy > min_energy) {
                                energy = min_energy;
                                t = -1;
                            }
                            // interior: stacking + bulge + internal;
                            min_energy = min(min_energy, internal(a, b, i, j, x, y, la, lb, xi, yj, an_int, bp_int));
                            if (energy > min_energy) {
                                energy = min_energy;
                                t = EB[index(a,b,i,j,x,y)];
                            }
                            // multiloop
                            min_energy = min(min_energy, multi_loop(a, b, i, j, x, y, pa, pb, n_codon_an, n_codon_bp));
                            if (energy > min_energy) {
                                energy = min_energy;
                                t = -3;
                            }
                            T[idx1] = min_energy;
                            T1[idx1] = t;
                            updatedT[idx1] = true;
                        } else {
                            t = T1[idx1];
                        }
                        min_energy = T[idx1];

                        Access_E(a,b,i,j,x,y) =  min_energy;

                        Access_EB(a,b,i,j,x,y) = t;
                        calculate_M(a,b,i,j,x,y);

                    }
                }
            }
        }

    }

}